

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getLiteralExpression(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == StringLiteral) {
    local_4 = StringLiteralExpression;
  }
  else if (kind == IntegerLiteral) {
    local_4 = IntegerLiteralExpression;
  }
  else if (kind == UnbasedUnsizedLiteral) {
    local_4 = UnbasedUnsizedLiteralExpression;
  }
  else if (kind == RealLiteral) {
    local_4 = RealLiteralExpression;
  }
  else if (kind == TimeLiteral) {
    local_4 = TimeLiteralExpression;
  }
  else if (kind == Dollar) {
    local_4 = WildcardLiteralExpression;
  }
  else if (kind == NullKeyword) {
    local_4 = NullLiteralExpression;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getLiteralExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::StringLiteral: return SyntaxKind::StringLiteralExpression;
        case TokenKind::IntegerLiteral: return SyntaxKind::IntegerLiteralExpression;
        case TokenKind::UnbasedUnsizedLiteral: return SyntaxKind::UnbasedUnsizedLiteralExpression;
        case TokenKind::RealLiteral: return SyntaxKind::RealLiteralExpression;
        case TokenKind::TimeLiteral: return SyntaxKind::TimeLiteralExpression;
        case TokenKind::NullKeyword: return SyntaxKind::NullLiteralExpression;
        case TokenKind::Dollar: return SyntaxKind::WildcardLiteralExpression;
        default: return SyntaxKind::Unknown;
    }
}